

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match.c
# Opt level: O0

int determine_correspondence
              (uchar *src,int *src_corners,int num_src_corners,uchar *ref,int *ref_corners,
              int num_ref_corners,int width,int height,int src_stride,int ref_stride,
              Correspondence *correspondences)

{
  _Bool _Var1;
  int iVar2;
  double *pdVar3;
  uchar *in_RCX;
  int in_EDX;
  long in_RSI;
  uchar *in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  Correspondence *correspondence;
  int patch_tl_y;
  int patch_tl_x;
  double v;
  double u;
  int ry;
  int rx;
  int sy;
  int sx;
  PointInfo *match_point;
  PointInfo *point_2;
  int i_2;
  double corr;
  PointInfo *ref_point;
  int j_1;
  PointInfo *src_point;
  int i_1;
  PointInfo *point_1;
  int ref_y;
  int ref_x;
  int j;
  int ref_point_count;
  PointInfo *point;
  int src_y;
  int src_x;
  int i;
  int src_point_count;
  int num_correspondences;
  PointInfo *ref_point_info;
  PointInfo *src_point_info;
  double *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  double local_e0;
  double local_d8;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int *local_c0;
  int *local_b8;
  int local_ac;
  double local_a8;
  int *local_a0;
  int local_94;
  int *local_90;
  int local_84;
  int *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  void *local_48;
  void *local_40;
  int local_34;
  long local_30;
  uchar *local_28;
  int local_1c;
  long local_18;
  uchar *local_10;
  
  local_40 = (void *)0x0;
  local_48 = (void *)0x0;
  local_4c = 0;
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_40 = aom_calloc(in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
  if ((local_40 != (void *)0x0) &&
     (local_48 = aom_calloc(in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00),
     local_48 != (void *)0x0)) {
    local_50 = 0;
    for (local_54 = 0; local_54 < local_1c; local_54 = local_54 + 1) {
      local_58 = *(int *)(local_18 + (long)(local_54 << 1) * 4);
      local_5c = *(int *)(local_18 + (long)(local_54 * 2 + 1) * 4);
      iVar2 = is_eligible_point(local_58,local_5c,in_stack_00000008,in_stack_00000010);
      if (iVar2 != 0) {
        local_68 = (int *)((long)local_40 + (long)local_50 * 0x28);
        *local_68 = local_58;
        local_68[1] = local_5c;
        local_68[8] = 0;
        local_68[9] = 0x3fe80000;
        _Var1 = (*aom_compute_mean_stddev)
                          (local_10,(int)correspondence,local_58,local_5c,(double *)(local_68 + 2),
                           (double *)(local_68 + 4));
        if (_Var1) {
          local_50 = local_50 + 1;
        }
      }
    }
    if (local_50 != 0) {
      local_6c = 0;
      for (local_70 = 0; local_70 < local_34; local_70 = local_70 + 1) {
        local_74 = *(int *)(local_30 + (long)(local_70 << 1) * 4);
        local_78 = *(int *)(local_30 + (long)(local_70 * 2 + 1) * 4);
        iVar2 = is_eligible_point(local_74,local_78,in_stack_00000008,in_stack_00000010);
        if (iVar2 != 0) {
          local_80 = (int *)((long)local_48 + (long)local_6c * 0x28);
          *local_80 = local_74;
          local_80[1] = local_78;
          local_80[8] = 0;
          local_80[9] = 0x3fe80000;
          _Var1 = (*aom_compute_mean_stddev)
                            (local_28,patch_tl_y,local_74,local_78,(double *)(local_80 + 2),
                             (double *)(local_80 + 4));
          if (_Var1) {
            local_6c = local_6c + 1;
          }
        }
      }
      if (local_6c != 0) {
        for (local_84 = 0; local_84 < local_50; local_84 = local_84 + 1) {
          local_90 = (int *)((long)local_40 + (long)local_84 * 0x28);
          for (local_94 = 0; local_94 < local_6c; local_94 = local_94 + 1) {
            local_a0 = (int *)((long)local_48 + (long)local_94 * 0x28);
            iVar2 = is_eligible_distance
                              (*local_90,local_90[1],*local_a0,local_a0[1],in_stack_00000008,
                               in_stack_00000010);
            if (iVar2 != 0) {
              in_stack_ffffffffffffff00 =
                   (double *)CONCAT44((int)((ulong)in_stack_ffffffffffffff00 >> 0x20),local_a0[1]);
              local_a8 = (*aom_compute_correlation)
                                   (local_10,(int)correspondence,*local_90,local_90[1],
                                    *(double *)(local_90 + 2),*(double *)(local_90 + 4),local_28,
                                    patch_tl_y,*local_a0,local_a0[1],*(double *)(local_a0 + 2),
                                    *(double *)(local_a0 + 4));
              if (*(double *)(local_90 + 8) <= local_a8 && local_a8 != *(double *)(local_90 + 8)) {
                local_90[6] = local_94;
                *(double *)(local_90 + 8) = local_a8;
              }
              if (*(double *)(local_a0 + 8) <= local_a8 && local_a8 != *(double *)(local_a0 + 8)) {
                local_a0[6] = local_84;
                *(double *)(local_a0 + 8) = local_a8;
              }
            }
          }
        }
        for (local_ac = 0; local_ac < local_50; local_ac = local_ac + 1) {
          local_b8 = (int *)((long)local_40 + (long)local_ac * 0x28);
          if ((0.75 < *(double *)(local_b8 + 8) || *(double *)(local_b8 + 8) == 0.75) &&
             (local_c0 = (int *)((long)local_48 + (long)local_b8[6] * 0x28), local_c0[6] == local_ac
             )) {
            local_c4 = *local_b8;
            local_c8 = local_b8[1];
            local_cc = *local_c0;
            local_d0 = local_c0[1];
            local_d8 = (double)(local_cc - local_c4);
            local_e0 = (double)(local_d0 - local_c8);
            in_stack_ffffffffffffff00 = &local_d8;
            (*aom_compute_flow_at_point)
                      (local_10,local_28,local_c4 + -3,local_c8 + -3,in_stack_00000008,
                       in_stack_00000010,(int)correspondence,in_stack_ffffffffffffff00,&local_e0);
            pdVar3 = (double *)((long)v + (long)local_4c * 0x20);
            *pdVar3 = (double)local_c4;
            pdVar3[1] = (double)local_c8;
            pdVar3[2] = (double)local_c4 + local_d8;
            pdVar3[3] = (double)local_c8 + local_e0;
            local_4c = local_4c + 1;
          }
        }
      }
    }
  }
  aom_free(in_stack_ffffffffffffff00);
  aom_free(in_stack_ffffffffffffff00);
  return local_4c;
}

Assistant:

static int determine_correspondence(const unsigned char *src,
                                    const int *src_corners, int num_src_corners,
                                    const unsigned char *ref,
                                    const int *ref_corners, int num_ref_corners,
                                    int width, int height, int src_stride,
                                    int ref_stride,
                                    Correspondence *correspondences) {
  PointInfo *src_point_info = NULL;
  PointInfo *ref_point_info = NULL;
  int num_correspondences = 0;

  src_point_info =
      (PointInfo *)aom_calloc(num_src_corners, sizeof(*src_point_info));
  if (!src_point_info) {
    goto finished;
  }

  ref_point_info =
      (PointInfo *)aom_calloc(num_ref_corners, sizeof(*ref_point_info));
  if (!ref_point_info) {
    goto finished;
  }

  // First pass (linear):
  // Filter corner lists and compute per-patch means and standard deviations,
  // for the src and ref frames independently
  int src_point_count = 0;
  for (int i = 0; i < num_src_corners; i++) {
    int src_x = src_corners[2 * i];
    int src_y = src_corners[2 * i + 1];
    if (!is_eligible_point(src_x, src_y, width, height)) continue;

    PointInfo *point = &src_point_info[src_point_count];
    point->x = src_x;
    point->y = src_y;
    point->best_match_corr = THRESHOLD_NCC;
    if (!aom_compute_mean_stddev(src, src_stride, src_x, src_y, &point->mean,
                                 &point->one_over_stddev))
      continue;
    src_point_count++;
  }
  if (src_point_count == 0) {
    goto finished;
  }

  int ref_point_count = 0;
  for (int j = 0; j < num_ref_corners; j++) {
    int ref_x = ref_corners[2 * j];
    int ref_y = ref_corners[2 * j + 1];
    if (!is_eligible_point(ref_x, ref_y, width, height)) continue;

    PointInfo *point = &ref_point_info[ref_point_count];
    point->x = ref_x;
    point->y = ref_y;
    point->best_match_corr = THRESHOLD_NCC;
    if (!aom_compute_mean_stddev(ref, ref_stride, ref_x, ref_y, &point->mean,
                                 &point->one_over_stddev))
      continue;
    ref_point_count++;
  }
  if (ref_point_count == 0) {
    goto finished;
  }

  // Second pass (quadratic):
  // For each pair of points, compute correlation, and use this to determine
  // the best match of each corner, in both directions
  for (int i = 0; i < src_point_count; ++i) {
    PointInfo *src_point = &src_point_info[i];
    for (int j = 0; j < ref_point_count; ++j) {
      PointInfo *ref_point = &ref_point_info[j];
      if (!is_eligible_distance(src_point->x, src_point->y, ref_point->x,
                                ref_point->y, width, height))
        continue;

      double corr = aom_compute_correlation(
          src, src_stride, src_point->x, src_point->y, src_point->mean,
          src_point->one_over_stddev, ref, ref_stride, ref_point->x,
          ref_point->y, ref_point->mean, ref_point->one_over_stddev);

      if (corr > src_point->best_match_corr) {
        src_point->best_match_idx = j;
        src_point->best_match_corr = corr;
      }
      if (corr > ref_point->best_match_corr) {
        ref_point->best_match_idx = i;
        ref_point->best_match_corr = corr;
      }
    }
  }

  // Third pass (linear):
  // Scan through source corners, generating a correspondence for each corner
  // iff ref_best_match[src_best_match[i]] == i
  // Then refine the generated correspondences using optical flow
  for (int i = 0; i < src_point_count; i++) {
    PointInfo *point = &src_point_info[i];

    // Skip corners which were not matched, or which didn't find
    // a good enough match
    if (point->best_match_corr < THRESHOLD_NCC) continue;

    PointInfo *match_point = &ref_point_info[point->best_match_idx];
    if (match_point->best_match_idx == i) {
      // Refine match using optical flow and store
      const int sx = point->x;
      const int sy = point->y;
      const int rx = match_point->x;
      const int ry = match_point->y;
      double u = (double)(rx - sx);
      double v = (double)(ry - sy);

      const int patch_tl_x = sx - DISFLOW_PATCH_CENTER;
      const int patch_tl_y = sy - DISFLOW_PATCH_CENTER;

      aom_compute_flow_at_point(src, ref, patch_tl_x, patch_tl_y, width, height,
                                src_stride, &u, &v);

      Correspondence *correspondence = &correspondences[num_correspondences];
      correspondence->x = (double)sx;
      correspondence->y = (double)sy;
      correspondence->rx = (double)sx + u;
      correspondence->ry = (double)sy + v;
      num_correspondences++;
    }
  }

finished:
  aom_free(src_point_info);
  aom_free(ref_point_info);
  return num_correspondences;
}